

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_table.c
# Opt level: O1

hash_iter_t * hash_table_iter_next(hash_iter_t *itor)

{
  hash_table_t *phVar1;
  ulong uVar2;
  ulong uVar3;
  hash_entry_t *phVar4;
  
  if (itor->ent != (hash_entry_t *)0x0) {
    itor->ent = itor->ent->next;
  }
  if (itor->ent == (hash_entry_t *)0x0) {
    phVar1 = itor->ht;
    uVar2 = itor->idx;
    uVar3 = (ulong)phVar1->size;
    if (uVar2 < uVar3) {
      phVar4 = phVar1->table + uVar2;
      do {
        if (phVar4->key != (char *)0x0) break;
        uVar2 = uVar2 + 1;
        itor->idx = uVar2;
        phVar4 = phVar4 + 1;
      } while (uVar3 != uVar2);
    }
    if (uVar2 == uVar3) {
      ckd_free(itor);
      itor = (hash_iter_t *)0x0;
    }
    else {
      itor->ent = phVar1->table + uVar2;
      itor->idx = uVar2 + 1;
    }
  }
  return itor;
}

Assistant:

hash_iter_t *
hash_table_iter_next(hash_iter_t *itor)
{
	/* If there is an entry, walk down its list. */
	if (itor->ent)
		itor->ent = itor->ent->next;
	/* If we got to the end of the chain, or we had no entry, scan
	 * forward in the table to find the next non-empty bucket. */
	if (itor->ent == NULL) {
		while (itor->idx < itor->ht->size
		       && itor->ht->table[itor->idx].key == NULL) 
			++itor->idx;
		/* If we did not find one then delete the iterator and
		 * return NULL. */
		if (itor->idx == itor->ht->size) {
			hash_table_iter_free(itor);
			return NULL;
		}
		/* Otherwise use this next entry. */
		itor->ent = itor->ht->table + itor->idx;
		/* Increase idx for the next time around. */
		++itor->idx;
	}
	return itor;
}